

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_xor.c
# Opt level: O0

_Bool array_array_container_xor(array_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  int iVar1;
  array_container_t *paVar2;
  bitset_container_t *pbVar3;
  uint64_t uVar4;
  array_container_t *in_RDX;
  int *in_RSI;
  int *in_RDI;
  bitset_container_t *ourbitset;
  _Bool returnval;
  int totalCardinality;
  int32_t in_stack_ffffffffffffffcc;
  array_container_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  byte bVar5;
  _Bool local_1;
  
  iVar1 = *in_RDI + *in_RSI;
  if (iVar1 < 0x1001) {
    paVar2 = array_container_create_given_capacity(in_stack_ffffffffffffffcc);
    *(array_container_t **)in_RDX = paVar2;
    array_container_xor(in_RDX,(array_container_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
                        in_stack_ffffffffffffffd0);
    local_1 = false;
  }
  else {
    pbVar3 = bitset_container_from_array(in_stack_ffffffffffffffd0);
    *(bitset_container_t **)in_RDX = pbVar3;
    bVar5 = 1;
    pbVar3 = *(bitset_container_t **)in_RDX;
    uVar4 = bitset_flip_list_withcard
                      (pbVar3->words,(long)*in_RDI,*(uint16_t **)(in_RSI + 2),(long)*in_RSI);
    pbVar3->cardinality = (int32_t)uVar4;
    if (pbVar3->cardinality < 0x1001) {
      paVar2 = array_container_from_bitset(pbVar3);
      *(array_container_t **)in_RDX = paVar2;
      bitset_container_free((bitset_container_t *)0x165f97);
      bVar5 = 0;
    }
    local_1 = (_Bool)(bVar5 & 1);
  }
  return local_1;
}

Assistant:

bool array_array_container_xor(const array_container_t *src_1,
                               const array_container_t *src_2,
                               container_t **dst) {
    int totalCardinality =
        src_1->cardinality + src_2->cardinality;  // upper bound
    if (totalCardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_create_given_capacity(totalCardinality);
        array_container_xor(src_1, src_2, CAST_array(*dst));
        return false;  // not a bitset
    }
    *dst = bitset_container_from_array(src_1);
    bool returnval = true;  // expect a bitset
    bitset_container_t *ourbitset = CAST_bitset(*dst);
    ourbitset->cardinality = (uint32_t)bitset_flip_list_withcard(
        ourbitset->words, src_1->cardinality, src_2->array, src_2->cardinality);
    if (ourbitset->cardinality <= DEFAULT_MAX_SIZE) {
        // need to convert!
        *dst = array_container_from_bitset(ourbitset);
        bitset_container_free(ourbitset);
        returnval = false;  // not going to be a bitset
    }

    return returnval;
}